

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_Multi_rec(Aig_Man_t *p,Aig_Obj_t **ppObjs,int nObjs,Aig_Type_t Type)

{
  Aig_Obj_t *p0;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Aig_Type_t Type_local;
  int nObjs_local;
  Aig_Obj_t **ppObjs_local;
  Aig_Man_t *p_local;
  
  if (nObjs == 1) {
    p_local = (Aig_Man_t *)*ppObjs;
  }
  else {
    p0 = Aig_Multi_rec(p,ppObjs,nObjs / 2,Type);
    p1 = Aig_Multi_rec(p,ppObjs + nObjs / 2,nObjs - nObjs / 2,Type);
    p_local = (Aig_Man_t *)Aig_Oper(p,p0,p1,Type);
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Aig_Multi_rec( Aig_Man_t * p, Aig_Obj_t ** ppObjs, int nObjs, Aig_Type_t Type )
{
    Aig_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Aig_Multi_rec( p, ppObjs,           nObjs/2,         Type );
    pObj2 = Aig_Multi_rec( p, ppObjs + nObjs/2, nObjs - nObjs/2, Type );
    return Aig_Oper( p, pObj1, pObj2, Type );
}